

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdflat.c
# Opt level: O2

void ngram_fwdflat_free_1ph(ngram_search_t *ngs)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (ngs->base).n_words;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  iVar2 = 0;
  for (; uVar3 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
    if (*(int *)((long)&((ngs->base).dict)->word->pronlen + uVar4) == 1) {
      hmm_deinit(&ngs->rhmm_1ph[iVar2].hmm);
      iVar2 = iVar2 + 1;
    }
  }
  ckd_free(ngs->rhmm_1ph);
  ngs->rhmm_1ph = (root_chan_t *)0x0;
  ckd_free(ngs->single_phone_wid);
  return;
}

Assistant:

static void
ngram_fwdflat_free_1ph(ngram_search_t *ngs)
{
    int i, w;
    int n_words = ps_search_n_words(ngs);

    for (i = w = 0; w < n_words; ++w) {
        if (!dict_is_single_phone(ps_search_dict(ngs), w))
            continue;
        hmm_deinit(&ngs->rhmm_1ph[i].hmm);
        ++i;
    }
    ckd_free(ngs->rhmm_1ph);
    ngs->rhmm_1ph = NULL;
    ckd_free(ngs->single_phone_wid);
}